

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_SmoothStep_Test::TestBody(Sampling_SmoothStep_Test *this)

{
  span<const_float> f;
  bool bVar1;
  Message *pMVar2;
  int in_EDI;
  int iVar3;
  float fVar4;
  Float FVar5;
  double dVar6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  Float dx;
  Float dp;
  Float cp;
  Float cx;
  Float u_1;
  Uniform1DIter __end1_1;
  Uniform1DIter __begin1_1;
  Uniform1D *__range1_1;
  PiecewiseConstant1D distrib;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  anon_class_1_0_00000001 ss;
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 checkErr;
  AssertionResult gtest_ar_3;
  Float ratio;
  Float x;
  Float u;
  Uniform1DIter __end1;
  Uniform1DIter __begin1;
  Uniform1D *__range1;
  AssertionResult gtest_ar_2;
  Float mid;
  AssertionResult gtest_ar_1;
  Float end;
  AssertionResult gtest_ar;
  Float start;
  Float in_stack_fffffffffffffba8;
  Float in_stack_fffffffffffffbac;
  PiecewiseConstant1D *in_stack_fffffffffffffbb0;
  PiecewiseConstant1D *in_stack_fffffffffffffbb8;
  Allocator in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  Float in_stack_fffffffffffffbcc;
  Float in_stack_fffffffffffffbd0;
  Float in_stack_fffffffffffffbd4;
  float in_stack_fffffffffffffbdc;
  AssertHelper *in_stack_fffffffffffffbe0;
  Message *in_stack_fffffffffffffbe8;
  Message *in_stack_fffffffffffffbf0;
  Message *in_stack_fffffffffffffbf8;
  PiecewiseConstant1D *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  AssertionResult *in_stack_fffffffffffffc28;
  Message *message;
  Float in_stack_fffffffffffffc30;
  Float in_stack_fffffffffffffc34;
  AssertionResult *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  Allocator in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc60;
  Float in_stack_fffffffffffffc64;
  AssertionResult *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  char *in_stack_fffffffffffffc78;
  AssertionResult local_2f8 [2];
  undefined8 local_2d8;
  float local_2cc;
  AssertionResult local_2c8;
  Float local_2b4;
  float local_2b0;
  Float local_2ac;
  Float local_2a8;
  Float local_2a4;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_288 [3];
  undefined1 local_270 [24];
  undefined1 *local_258;
  undefined1 local_238 [88];
  Message local_1e0 [9];
  string local_198 [48];
  AssertionResult local_168 [2];
  undefined8 local_140;
  float local_134;
  AssertionResult local_130;
  float local_11c;
  Float local_118;
  Float local_114;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_f8 [3];
  undefined1 local_e0 [24];
  undefined1 *local_c8;
  undefined8 local_b0;
  double local_a8;
  AssertionResult local_a0;
  Float local_8c;
  undefined8 local_78;
  float local_6c;
  AssertionResult local_68;
  Float local_54;
  undefined8 local_30;
  float local_24;
  AssertionResult local_20;
  Float local_c;
  
  local_c = pbrt::SampleSmoothStep
                      (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc
                      );
  fVar4 = local_c - 10.0;
  std::abs(in_EDI);
  local_30 = 0x3fb999999999999a;
  local_24 = fVar4;
  testing::internal::CmpHelperLT<float,double>
            (in_stack_fffffffffffffc78,
             (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             (float *)in_stack_fffffffffffffc68,
             (double *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffbb0,
               (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    testing::AssertionResult::failure_message((AssertionResult *)0x63c66f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (Message *)in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x63c6d2);
  }
  iVar3 = (int)&local_20;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x63c72a);
  local_54 = pbrt::SampleSmoothStep
                       (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                        in_stack_fffffffffffffbcc);
  fVar4 = local_54 - -5.0;
  std::abs(iVar3);
  local_78 = 0x3ee4f8b588e368f1;
  local_6c = fVar4;
  testing::internal::CmpHelperLT<float,double>
            (in_stack_fffffffffffffc78,
             (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             (float *)in_stack_fffffffffffffc68,
             (double *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffbb0,
               (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    testing::AssertionResult::failure_message((AssertionResult *)0x63c850);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (Message *)in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x63c8b3);
  }
  iVar3 = (int)&local_68;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x63c90b);
  local_8c = pbrt::SampleSmoothStep
                       (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                        in_stack_fffffffffffffbcc);
  dVar6 = (double)local_8c + -0.733615;
  std::abs(iVar3);
  local_b0 = 0x3ee4f8b588e368f1;
  local_a8 = dVar6;
  testing::internal::CmpHelperLT<double,double>
            (in_stack_fffffffffffffc78,
             (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             (double *)in_stack_fffffffffffffc68,
             (double *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffbb0,
               (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    in_stack_fffffffffffffc78 =
         testing::AssertionResult::failure_message((AssertionResult *)0x63ca27);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (Message *)in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x63ca8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x63cae2);
  pbrt::Uniform1D::RNGGenerator
            ((Uniform1D *)in_stack_fffffffffffffbc0.memoryResource,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(uint64_t)in_stack_fffffffffffffbb0,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  local_c8 = local_e0;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffbb0);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffbb0);
  while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                           ((IndexingIterator<pbrt::detail::Uniform1DIter> *)
                            in_stack_fffffffffffffbb0,
                            (Uniform1DIter *)
                            CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)), bVar1) {
    iVar3 = (int)local_f8;
    local_114 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x63cb67);
    in_stack_fffffffffffffc60 = 0x40a00000;
    local_118 = pbrt::SampleSmoothStep
                          (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                           in_stack_fffffffffffffbcc);
    in_stack_fffffffffffffc64 =
         pbrt::SmoothStep(SUB84(in_stack_fffffffffffffbb0,0),in_stack_fffffffffffffbac,
                          in_stack_fffffffffffffba8);
    FVar5 = pbrt::SmoothStepPDF(SUB84(in_stack_fffffffffffffbb0,0),in_stack_fffffffffffffbac,
                                in_stack_fffffffffffffba8);
    local_11c = in_stack_fffffffffffffc64 / FVar5;
    fVar4 = local_11c + -4.0;
    std::abs(iVar3);
    local_140 = 0x3ee4f8b588e368f1;
    in_stack_fffffffffffffc68 = &local_130;
    local_134 = fVar4;
    testing::internal::CmpHelperLT<float,double>
              (in_stack_fffffffffffffc78,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (float *)in_stack_fffffffffffffc68,
               (double *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    in_stack_fffffffffffffc77 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc68);
    if (!(bool)in_stack_fffffffffffffc77) {
      testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffbb0,
                 (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffc48.memoryResource =
           (memory_resource *)testing::AssertionResult::failure_message((AssertionResult *)0x63cd02)
      ;
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)in_stack_fffffffffffffc28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0x63cd65);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63cdbd);
    in_stack_fffffffffffffc34 = local_114;
    pbrt::InvertSmoothStepSample
              ((Float)((ulong)in_stack_fffffffffffffbc0.memoryResource >> 0x20),
               SUB84(in_stack_fffffffffffffbc0.memoryResource,0),
               (Float)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
    TestBody::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbc0.memoryResource,
               (Float)((ulong)in_stack_fffffffffffffbb8 >> 0x20),SUB84(in_stack_fffffffffffffbb8,0))
    ;
    in_stack_fffffffffffffc38 = local_168;
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffbb0,
               SUB41((uint)in_stack_fffffffffffffbac >> 0x18,0));
    in_stack_fffffffffffffc47 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc38);
    if (!(bool)in_stack_fffffffffffffc47) {
      testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffc28,
                 (char *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (Message *)in_stack_fffffffffffffc28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_198);
      testing::Message::~Message((Message *)0x63cf1d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63cf95);
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_f8);
  }
  message = local_1e0;
  std::function<float(float)>::function<Sampling_SmoothStep_Test::TestBody()::__0&,void>
            ((function<float_(float)> *)in_stack_fffffffffffffbc0.memoryResource,
             (anon_class_1_0_00000001 *)in_stack_fffffffffffffbb8);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbb0);
  pbrt::Sample1DFunction
            ((function<float_(float)> *)
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
             (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),(int)in_stack_fffffffffffffc38,
             in_stack_fffffffffffffc34,in_stack_fffffffffffffc30,in_stack_fffffffffffffc48);
  std::function<float_(float)>::~function((function<float_(float)> *)0x63d025);
  pstd::span<float_const>::
  span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
            ((span<const_float> *)in_stack_fffffffffffffbc0.memoryResource,
             &in_stack_fffffffffffffbb8->func);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbb0);
  f.ptr._4_4_ = in_stack_fffffffffffffbcc;
  f.ptr._0_4_ = in_stack_fffffffffffffbc8;
  f.n._0_4_ = in_stack_fffffffffffffbd0;
  f.n._4_4_ = in_stack_fffffffffffffbd4;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D
            (in_stack_fffffffffffffbb8,f,in_stack_fffffffffffffbc0);
  pbrt::Uniform1D::RNGGenerator
            ((Uniform1D *)in_stack_fffffffffffffbc0.memoryResource,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(uint64_t)in_stack_fffffffffffffbb0,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  local_258 = local_270;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffbb0);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffbb0);
  while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                           ((IndexingIterator<pbrt::detail::Uniform1DIter> *)
                            in_stack_fffffffffffffbb0,
                            (Uniform1DIter *)
                            CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)), bVar1) {
    local_2a4 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x63d106);
    local_2a8 = pbrt::SampleSmoothStep
                          (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                           in_stack_fffffffffffffbcc);
    local_2ac = pbrt::SmoothStepPDF(SUB84(in_stack_fffffffffffffbb0,0),in_stack_fffffffffffffbac,
                                    in_stack_fffffffffffffba8);
    iVar3 = (int)local_238;
    local_2b4 = pbrt::PiecewiseConstant1D::Sample
                          (in_stack_fffffffffffffc00,
                           (Float)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                           (Float *)in_stack_fffffffffffffbf0,(int *)in_stack_fffffffffffffbe8);
    fVar4 = local_2a8 - local_2b4;
    std::abs(iVar3);
    local_2d8 = 0x3f689374bc6a7efa;
    local_2cc = fVar4;
    testing::internal::CmpHelperLT<float,double>
              (in_stack_fffffffffffffc78,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (float *)in_stack_fffffffffffffc68,
               (double *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
      in_stack_fffffffffffffc00 =
           (PiecewiseConstant1D *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffbb0,
                      (char (*) [15])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbf8 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffbb0,
                      (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbf0 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffbb0,
                      (char (*) [13])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbe8 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffbb0,
                      (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbe0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x63d33d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0x63d397);
    }
    iVar3 = (int)&local_2c8;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63d3ef);
    in_stack_fffffffffffffbdc = local_2ac - local_2b0;
    std::abs(iVar3);
    testing::internal::CmpHelperLT<float,double>
              (in_stack_fffffffffffffc78,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (float *)in_stack_fffffffffffffc68,
               (double *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
      pMVar2 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffbb0,
                          (char (*) [19])
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbd0 = SUB84(pMVar2,0);
      in_stack_fffffffffffffbd4 = (Float)((ulong)pMVar2 >> 0x20);
      pMVar2 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffbb0,
                          (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbcc = (Float)((ulong)pMVar2 >> 0x20);
      in_stack_fffffffffffffbc0.memoryResource =
           (memory_resource *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffbb0,
                      (char (*) [17])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffbb0,
                 (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbb0 =
           (PiecewiseConstant1D *)
           testing::AssertionResult::failure_message((AssertionResult *)0x63d52e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbdc,
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (int)in_stack_fffffffffffffbcc,(char *)in_stack_fffffffffffffbc0.memoryResource);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
      testing::Message::~Message((Message *)0x63d588);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63d5dd);
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_288);
  }
  pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffbb0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            (&in_stack_fffffffffffffbb0->func);
  return;
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}